

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O0

int32 read_reg_mat(char *regmatfn,uint32 **veclen,uint32 *n_class,uint32 *n_stream,float32 *****A,
                  float32 ****B)

{
  float32 *pfVar1;
  undefined1 local_7c [4];
  float32 ***pppfStack_78;
  float32 dummy;
  float32 ***lB;
  float32 ****lA;
  uint32 *vlen;
  FILE *fp;
  uint32 nclass;
  uint32 nstream;
  uint32 m;
  uint32 k;
  uint32 j;
  uint32 i;
  float32 ****B_local;
  float32 *****A_local;
  uint32 *n_stream_local;
  uint32 *n_class_local;
  uint32 **veclen_local;
  char *regmatfn_local;
  
  _j = B;
  B_local = (float32 ****)A;
  A_local = (float32 *****)n_stream;
  n_stream_local = n_class;
  n_class_local = (uint32 *)veclen;
  veclen_local = (uint32 **)regmatfn;
  vlen = (uint32 *)fopen(regmatfn,"r");
  if ((FILE *)vlen == (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
            ,0x66,"Unable to open %s to read MLLR matrices\n",veclen_local);
    regmatfn_local._4_4_ = -1;
  }
  else {
    __isoc99_fscanf(vlen,"%d",&fp);
    __isoc99_fscanf(vlen,"%d",(long)&fp + 4);
    lA = (float32 ****)
         __ckd_calloc__((ulong)fp._4_4_,4,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                        ,0x6c);
    lB = (float32 ***)
         __ckd_calloc_2d__((ulong)(uint)fp,(ulong)fp._4_4_,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                           ,0x6d);
    pppfStack_78 = (float32 ***)
                   __ckd_calloc_2d__((ulong)(uint)fp,(ulong)fp._4_4_,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                     ,0x6e);
    for (nclass = 0; nclass < (uint)fp; nclass = nclass + 1) {
      for (k = 0; k < fp._4_4_; k = k + 1) {
        __isoc99_fscanf(vlen,"%d",(long)lA + (ulong)k * 4);
        pfVar1 = (float32 *)
                 __ckd_calloc_2d__((ulong)*(uint *)((long)lA + (ulong)k * 4),
                                   (ulong)*(uint *)((long)lA + (ulong)k * 4),4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                   ,0x72);
        lB[nclass][k] = pfVar1;
        pfVar1 = (float32 *)
                 __ckd_calloc__((ulong)*(uint *)((long)lA + (ulong)k * 4),4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                ,0x73);
        pppfStack_78[nclass][k] = pfVar1;
        for (m = 0; m < *(uint *)((long)lA + (ulong)k * 4); m = m + 1) {
          for (nstream = 0; nstream < *(uint *)((long)lA + (ulong)k * 4); nstream = nstream + 1) {
            __isoc99_fscanf(vlen,"%f ",*(long *)(lB[nclass][k] + (ulong)m * 2) + (ulong)nstream * 4)
            ;
          }
        }
        for (m = 0; m < *(uint *)((long)lA + (ulong)k * 4); m = m + 1) {
          __isoc99_fscanf(vlen,"%f ",pppfStack_78[nclass][k] + m);
        }
        for (m = 0; m < *(uint *)((long)lA + (ulong)k * 4); m = m + 1) {
          __isoc99_fscanf(vlen,"%f ",local_7c);
        }
      }
    }
    *n_stream_local = (uint)fp;
    *(uint *)A_local = fp._4_4_;
    *(float32 *****)n_class_local = lA;
    *B_local = lB;
    *_j = pppfStack_78;
    fclose((FILE *)vlen);
    regmatfn_local._4_4_ = 0;
  }
  return regmatfn_local._4_4_;
}

Assistant:

int32
read_reg_mat (
             const char   *regmatfn,
             uint32  **veclen,
             uint32  *n_class,
             uint32  *n_stream,
             float32 *****A,
             float32 ****B
            )
{
    uint32 i,j,k,m,nstream,nclass;
    FILE  *fp;
    uint32 *vlen;
    float32 ****lA,***lB;

    if ((fp = fopen(regmatfn,"r")) == NULL) {
	E_INFO("Unable to open %s to read MLLR matrices\n",regmatfn);
	return S3_ERROR;
    }

    fscanf(fp,"%d",&nclass);
    fscanf(fp,"%d",&nstream);
    vlen = (uint32 *)ckd_calloc(nstream,sizeof(uint32));
    lA = (float32 ****)ckd_calloc_2d (nclass,nstream,sizeof (float32 **));
    lB = (float32 ***)ckd_calloc_2d (nclass,nstream,sizeof (float32 *));
    for (m = 0; m < nclass; ++m) {
	for (i = 0; i < nstream; ++i) {
	    fscanf(fp,"%d", &vlen[i]);
	    lA[m][i] = (float32 **) ckd_calloc_2d(vlen[i],vlen[i],sizeof(float32));
	    lB[m][i] = (float32 *) ckd_calloc(vlen[i],sizeof(float32));
	    for (j = 0; j < vlen[i]; j++) {
		for (k = 0; k < vlen[i]; ++k) {
		    fscanf(fp,"%f ",&lA[m][i][j][k]);
		}
	    }
	    for (j = 0; j < vlen[i]; j++) {
		fscanf(fp,"%f ",&lB[m][i][j]);
	    }
	    /* Identity transform for variances. */
	    for (j = 0; j < vlen[i]; j++) {
		float32 dummy;
		fscanf(fp,"%f ",&dummy);
	    }
	}
    }

    *n_class = nclass;
    *n_stream = nstream;
    *veclen = vlen;
    *A = lA;
    *B = lB;

    fclose(fp);
    return S3_SUCCESS;
}